

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O3

bool __thiscall QFontDef::operator==(QFontDef *this,QFontDef *other)

{
  long lVar1;
  compare_eq_result_container<QList<QString>,_QString> cVar2;
  char cVar3;
  bool bVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  if (((this->pixelSize == other->pixelSize) && (!NAN(this->pixelSize) && !NAN(other->pixelSize)))
     && (((*(ulong *)&other->field_0x60 ^ *(ulong *)&this->field_0x60) & 0xfffff3fffffff) == 0)) {
    cVar2 = QList<QString>::operator==(&this->families,&other->families);
    if ((cVar2) && (lVar1 = (this->styleName).d.size, lVar1 == (other->styleName).d.size)) {
      QVar5.m_data = (this->styleName).d.ptr;
      QVar5.m_size = lVar1;
      QVar6.m_data = (other->styleName).d.ptr;
      QVar6.m_size = lVar1;
      cVar3 = QtPrivate::equalStrings(QVar5,QVar6);
      if ((cVar3 != '\0') &&
         (((*(uint *)&other->field_0x60 ^ *(uint *)&this->field_0x60) & 0xc0000000) == 0)) {
        bVar4 = comparesEqual<QFont::Tag,_float,_true>
                          (&this->variableAxisValues,&other->variableAxisValues);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const QFontDef &other) const
    {
        return pixelSize == other.pixelSize
                    && weight == other.weight
                    && style == other.style
                    && stretch == other.stretch
                    && styleHint == other.styleHint
                    && styleStrategy == other.styleStrategy
                    && ignorePitch == other.ignorePitch && fixedPitch == other.fixedPitch
                    && families == other.families
                    && styleName == other.styleName
                    && hintingPreference == other.hintingPreference
                    && variableAxisValues == other.variableAxisValues
                          ;
    }